

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void solitary(tgestate_t *state)

{
  int iVar1;
  tgestate_t *in_RDI;
  uint8_t area;
  mappos8_t *itempos;
  item_t item_and_flags;
  itemstruct_t *pitemstruct;
  vischar_t *vischar;
  uint8_t iters;
  item_t item;
  item_t *pitem;
  uint8_t local_39;
  mappos8_t *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  item_t in_stack_ffffffffffffffd7;
  itemstruct_t *local_28;
  char local_12;
  tgestate_t *state_00;
  
  in_RDI->bell = 0xff;
  in_RDI->items_held[0] = 0xff;
  item_discovered((tgestate_t *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                  (item_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
  state_00 = (tgestate_t *)(in_RDI->items_held + 1);
  *(undefined1 *)&state_00->width = 0xff;
  item_discovered((tgestate_t *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                  (item_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
  draw_all_items((tgestate_t *)0x10bb57);
  local_12 = '\x10';
  local_28 = in_RDI->item_structs;
  do {
    if ((local_28->room_and_flags & 0x3f) == 0) {
      in_stack_ffffffffffffffd7 = local_28->item_and_flags;
      in_stack_ffffffffffffffc8 = &local_28->mappos;
      local_39 = '\0';
      do {
        iVar1 = within_camp_bounds(local_39,in_stack_ffffffffffffffc8);
        if (iVar1 != 0) {
          item_discovered((tgestate_t *)
                          CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                          (item_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
          break;
        }
        local_39 = local_39 + '\x01';
      } while (local_39 != '\x03');
    }
    local_28 = local_28 + 1;
    local_12 = local_12 + -1;
    if (local_12 == '\0') {
      in_RDI->vischars[0].room = '\x18';
      in_RDI->current_door = '\x14';
      decrease_morale(in_RDI,'#');
      reset_map_and_characters(state_00);
      in_RDI->character_structs[0].room = '\0';
      in_RDI->character_structs[0].mappos.u = 't';
      in_RDI->character_structs[0].mappos.v = 'd';
      in_RDI->character_structs[0].mappos.w = '\x03';
      in_RDI->character_structs[0].route.index = '$';
      in_RDI->character_structs[0].route.step = '\0';
      queue_message(in_RDI,message_YOU_ARE_IN_SOLITARY);
      queue_message(in_RDI,message_WAIT_FOR_RELEASE);
      queue_message(in_RDI,message_ANOTHER_DAY_DAWNS);
      in_RDI->in_solitary = 0xff;
      in_RDI->automatic_player_counter = '\0';
      in_RDI->vischars[0].mi.sprite = sprites + 2;
      in_RDI->IY = in_RDI->vischars;
      in_RDI->vischars[0].direction = '\x03';
      in_RDI->vischars[0].route.index = '\0';
      transition((tgestate_t *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      return;
    }
  } while( true );
}

Assistant:

void solitary(tgestate_t *state)
{
  /**
   * $7AC6: Solitary map position.
   */
  static const mappos8_t solitary_pos =
  {
    58, 42, 24
  };

  /**
   * $CC31: Partial character struct.
   */
  static const characterstruct_t commandant_reset_data =
  {
    0,               /* character_and_flags */
    room_0_OUTDOORS, /* room */
    { 116, 100, 3 }, /* pos */
    { 36, 0 }        /* route */
  };

  item_t       *pitem;       /* was HL */
  item_t        item;        /* was C */
  uint8_t       iters;       /* was B */
  vischar_t    *vischar;     /* was IY */
  itemstruct_t *pitemstruct; /* was HL */

  assert(state != NULL);

  /* Silence the bell. */
  state->bell = bell_STOP;

  /* Seize the hero's held items. */
  pitem = &state->items_held[0];
  item = *pitem;
  *pitem = item_NONE;
  item_discovered(state, item);

  pitem = &state->items_held[1];
  item = *pitem;
  *pitem = item_NONE;
  item_discovered(state, item);

  draw_all_items(state);

  /* Discover all items. */
  iters = item__LIMIT;
  pitemstruct = &state->item_structs[0];
  do
  {
    /* Is the item outdoors? */
    if ((pitemstruct->room_and_flags & itemstruct_ROOM_MASK) == room_0_OUTDOORS)
    {
      item_t     item_and_flags; /* was A */
      mappos8_t *itempos;        /* was HL */
      uint8_t    area;           /* was A' */

      item_and_flags = pitemstruct->item_and_flags;
      itempos = &pitemstruct->mappos;
      area = 0; /* iterate 0,1,2 */
      do
        /* If the item is within the camp bounds then it will be discovered.
         */
        if (within_camp_bounds(area, itempos))
          goto discovered;
      while (++area != 3);

      goto next;

discovered:
      item_discovered(state, item_and_flags);
    }

next:
    pitemstruct++;
  }
  while (--iters);

  /* Move the hero to solitary. */
  state->vischars[0].room = room_24_SOLITARY;

  /* I reckon this should be 24 which is the door between room_22_REDKEY and
   * room_24_SOLITARY. */
  state->current_door = 20;

  decrease_morale(state, 35);

  reset_map_and_characters(state);

  /* Set the commandant on a path which results in the hero being released. */
  memcpy(&state->character_structs[character_0_COMMANDANT].room,
         &commandant_reset_data.room,
         sizeof(characterstruct_t) - offsetof(characterstruct_t, room));

  /* Queue solitary messages. */
  queue_message(state, message_YOU_ARE_IN_SOLITARY);
  queue_message(state, message_WAIT_FOR_RELEASE);
  queue_message(state, message_ANOTHER_DAY_DAWNS);

  state->in_solitary = 255; /* inhibit user input */
  state->automatic_player_counter = 0; /* immediately take automatic control of hero */
  state->vischars[0].mi.sprite = &sprites[sprite_PRISONER_FACING_AWAY_1];
  vischar = &state->vischars[0];
  state->IY = &state->vischars[0];
  vischar->direction = direction_BOTTOM_LEFT;
  state->vischars[0].route.index = routeindex_0_HALT; /* Stand still. */ // stores a byte, not a word
  transition(state, &solitary_pos);

  NEVER_RETURNS;
}